

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# green.c
# Opt level: O3

int green_future_release(green_future_t future)

{
  undefined4 local_c;
  
  if (future == (green_future_t)0x0) {
    return 1;
  }
  green_future_release_cold_1();
  return local_c;
}

Assistant:

int green_future_release(green_future_t future)
{
    if (future == NULL) {
        return GREEN_EINVAL;
    }
    fprintf(stderr, "green_future_release(%p, %d)\n", future, future->refs);
    // NOTE: async operations hold an implicit ref count, so there is no risk
    //       of async operations dereferencing a dangling pointer when
    //       attempting to resolve the future.
    green_assert(future != NULL);
    green_assert(future->refs > 0);
    if (--future->refs == 0) {
        green_assert(future->poller == NULL);
        green_free(future);
    }
    return GREEN_SUCCESS;
}